

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uchar anon_unknown.dwarf_ff84f::ParseEscapeSequence
                (ExpressionContext *ctx,SynBase *source,char *str)

{
  uchar uVar1;
  
  if (*str == '\\') {
    uVar1 = str[1];
    if ((uVar1 != '\"') && (uVar1 != '\'')) {
      if (uVar1 == '0') {
        uVar1 = '\0';
      }
      else if (uVar1 != '\\') {
        if (uVar1 == 'n') {
          uVar1 = '\n';
        }
        else if (uVar1 == 't') {
          uVar1 = '\t';
        }
        else if (uVar1 == 'r') {
          uVar1 = '\r';
        }
        else {
          uVar1 = '\0';
          ReportAt(ctx,source,str,"ERROR: unknown escape sequence");
        }
      }
    }
    return uVar1;
  }
  __assert_fail("str[0] == \'\\\\\'",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0xc2,
                "unsigned char (anonymous namespace)::ParseEscapeSequence(ExpressionContext &, SynBase *, const char *)"
               );
}

Assistant:

unsigned char ParseEscapeSequence(ExpressionContext &ctx, SynBase *source, const char* str)
	{
		assert(str[0] == '\\');

		switch(str[1])
		{
		case 'n':
			return '\n';
		case 'r':
			return '\r';
		case 't':
			return '\t';
		case '0':
			return '\0';
		case '\'':
			return '\'';
		case '\"':
			return '\"';
		case '\\':
			return '\\';
		}

		ReportAt(ctx, source, str, "ERROR: unknown escape sequence");

		return 0;
	}